

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_float_suite::test_linear_increase(void)

{
  float absolute_tolerance;
  float local_b0;
  value_type_conflict local_ac [3];
  float local_a0;
  value_type_conflict local_9c [3];
  float local_90;
  value_type_conflict local_8c [3];
  float local_80;
  value_type_conflict local_7c [3];
  float local_70;
  value_type_conflict local_6c [3];
  float local_60;
  value_type_conflict local_5c [3];
  float local_50;
  value_type_conflict local_4c [3];
  float local_40;
  value_type_conflict local_3c [3];
  float local_30;
  value_type_conflict local_2c [4];
  undefined1 local_1c [8];
  moment<float> filter;
  close_to<float> tolerance;
  
  absolute_tolerance = std::numeric_limits<float>::min();
  trial::online::detail::close_to<float>::close_to
            ((close_to<float> *)&filter.normalization,1e-05,absolute_tolerance);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::basic_moment
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,0.125);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,1.0);
  local_2c[2] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_2c[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("filter.mean()","1.0f",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xf9,"void mean_float_suite::test_linear_increase()",local_2c + 2,local_2c + 1);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,2.0);
  local_2c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_30 = 1.53333;
  local_3c[1] = filter.normalization;
  local_3c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","1.53333f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xfb,"void mean_float_suite::test_linear_increase()",local_2c,&local_30,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,3.0);
  local_3c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_40 = 2.08876;
  local_4c[1] = filter.normalization;
  local_4c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","2.08876f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xfd,"void mean_float_suite::test_linear_increase()",local_3c,&local_40,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,4.0);
  local_4c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_50 = 2.66608;
  local_5c[1] = filter.normalization;
  local_5c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","2.66608f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0xff,"void mean_float_suite::test_linear_increase()",local_4c,&local_50,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,6.0);
  local_5c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_60 = 3.52165;
  local_6c[1] = filter.normalization;
  local_6c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","3.52165f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x101,"void mean_float_suite::test_linear_increase()",local_5c,&local_60,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,5.0);
  local_6c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_70 = 3.8569;
  local_7c[1] = filter.normalization;
  local_7c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","3.85690f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x103,"void mean_float_suite::test_linear_increase()",local_6c,&local_70,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,7.0);
  local_7c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_80 = 4.50384;
  local_8c[1] = filter.normalization;
  local_8c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","4.50384f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x105,"void mean_float_suite::test_linear_increase()",local_7c,&local_80,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,8.0);
  local_8c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_90 = 5.16963;
  local_9c[1] = filter.normalization;
  local_9c[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.16963f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x107,"void mean_float_suite::test_linear_increase()",local_8c,&local_90,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,9.0);
  local_9c[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_a0 = 5.85427;
  local_ac[1] = filter.normalization;
  local_ac[2] = filter.sum.mean;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","5.85427f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x109,"void mean_float_suite::test_linear_increase()",local_9c,&local_a0,
             (close_to<float>)filter._4_8_);
  trial::online::decay::basic_moment<float,_(trial::online::with)1>::push
            ((basic_moment<float,_(trial::online::with)1> *)local_1c,10.0);
  local_ac[0] = trial::online::decay::basic_moment<float,_(trial::online::with)1>::mean
                          ((basic_moment<float,_(trial::online::with)1> *)local_1c);
  local_b0 = 6.55748;
  trial::online::detail::test_with_impl<float,trial::online::detail::close_to>
            ("filter.mean()","6.55748f","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x10b,"void mean_float_suite::test_linear_increase()",local_ac,&local_b0,
             (close_to<float>)filter._4_8_);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<float>(1e-5f);
    decay::moment<float> filter(one_over_eight);
    filter.push(1.0f);
    TRIAL_TEST_EQ(filter.mean(), 1.0f);
    filter.push(2.0f);
    TRIAL_TEST_WITH(filter.mean(), 1.53333f, tolerance);
    filter.push(3.0f);
    TRIAL_TEST_WITH(filter.mean(), 2.08876f, tolerance);
    filter.push(4.0f);
    TRIAL_TEST_WITH(filter.mean(), 2.66608f, tolerance);
    filter.push(6.0f);
    TRIAL_TEST_WITH(filter.mean(), 3.52165f, tolerance);
    filter.push(5.0f);
    TRIAL_TEST_WITH(filter.mean(), 3.85690f, tolerance);
    filter.push(7.0f);
    TRIAL_TEST_WITH(filter.mean(), 4.50384f, tolerance);
    filter.push(8.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.16963f, tolerance);
    filter.push(9.0f);
    TRIAL_TEST_WITH(filter.mean(), 5.85427f, tolerance);
    filter.push(10.0f);
    TRIAL_TEST_WITH(filter.mean(), 6.55748f, tolerance);
}